

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O1

void __thiscall
matrix_sparse_row_test_empty_row_Test::TestBody(matrix_sparse_row_test_empty_row_Test *this)

{
  pointer piVar1;
  pointer_index piVar2;
  pointer_index piVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  StringLike<const_char_*> *regex;
  pointer *__ptr;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Matrix_Sparse_Row<double,_int> row;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_b8;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_a8;
  Message local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90 [3];
  Matrix_Sparse_Row<double,_int> local_78;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  local_78.ptr_data = &(this->super_matrix_sparse_row_test).csr_data;
  piVar1 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_78.iter_row_offset._M_current = piVar1 + 1;
  lVar8 = (long)piVar1[1];
  local_78.i_column._M_ptr =
       (this->super_matrix_sparse_row_test).csr_data.i_column.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
       lVar8;
  local_78.i_column._M_extent._M_extent_value = piVar1[2] - lVar8;
  local_78.value._M_ptr =
       (this->super_matrix_sparse_row_test).csr_data.value.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       + lVar8;
  local_b8.ptr_column = (pointer_index)CONCAT44(local_b8.ptr_column._4_4_,piVar1[2]);
  local_a8.ptr_column = (pointer_index)CONCAT44(local_a8.ptr_column._4_4_,2);
  local_78.value._M_extent._M_extent_value = local_78.i_column._M_extent._M_extent_value;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_98,"row.row_offset()","2",(int *)&local_b8,(int *)&local_a8);
  if (local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_90[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_90[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x152,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_b8.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b8.ptr_column + 8))();
    }
  }
  if (local_90[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90,local_90[0]);
  }
  local_b8.ptr_column =
       (pointer_index)
       CONCAT44(local_b8.ptr_column._4_4_,
                local_78.iter_row_offset._M_current[1] - *local_78.iter_row_offset._M_current);
  local_a8.ptr_column = (pointer_index)((ulong)local_a8.ptr_column & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_98,"row.size_non_zero()","0",(int *)&local_b8,(int *)&local_a8);
  if (local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_90[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_90[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x153,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_b8.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b8.ptr_column + 8))();
    }
  }
  if (local_90[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90,local_90[0]);
  }
  local_b8.ptr_column =
       (pointer_index)
       CONCAT44(local_b8.ptr_column._4_4_,
                (int)((ulong)((long)local_78.iter_row_offset._M_current -
                             (long)((local_78.ptr_data)->row_offset).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2));
  local_a8.ptr_column = (pointer_index)CONCAT44(local_a8.ptr_column._4_4_,1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_98,"row.row()","1",(int *)&local_b8,(int *)&local_a8);
  if (local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_90[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_90[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x154,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_b8.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b8.ptr_column + 8))();
    }
  }
  if (local_90[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90,local_90[0]);
  }
  local_b8.ptr_column = local_78.i_column._M_ptr;
  local_b8.ptr_entry = local_78.value._M_ptr;
  local_a8.ptr_column =
       (pointer_index)
       ((long)local_78.i_column._M_ptr + local_78.i_column._M_extent._M_extent_value * 4);
  local_a8.ptr_entry = local_78.value._M_ptr + local_78.value._M_extent._M_extent_value;
  testing::internal::
  CmpHelperEQ<Disa::Base_Iterator_Matrix_Sparse_Element<double,int,false>,Disa::Base_Iterator_Matrix_Sparse_Element<double,int,false>>
            ((internal *)&local_98,"row.begin()","row.end()",&local_b8,&local_a8);
  if (local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_90[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_90[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x155,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_b8.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b8.ptr_column + 8))();
    }
  }
  if (local_90[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90,local_90[0]);
  }
  local_b8.ptr_column = local_78.i_column._M_ptr;
  local_b8.ptr_entry = local_78.value._M_ptr;
  local_a8.ptr_column =
       (pointer_index)
       ((long)local_78.i_column._M_ptr + local_78.i_column._M_extent._M_extent_value * 4);
  local_a8.ptr_entry = local_78.value._M_ptr + local_78.value._M_extent._M_extent_value;
  testing::internal::
  CmpHelperEQ<Disa::Base_Iterator_Matrix_Sparse_Element<double,int,true>,Disa::Base_Iterator_Matrix_Sparse_Element<double,int,true>>
            ((internal *)&local_98,"row.cbegin()","row.cend()",
             (Base_Iterator_Matrix_Sparse_Element<double,_int,_true> *)&local_b8,
             (Base_Iterator_Matrix_Sparse_Element<double,_int,_true> *)&local_a8);
  if (local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_90[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_90[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x156,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_b8.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b8.ptr_column + 8))();
    }
  }
  if (local_90[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90,local_90[0]);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (!bVar4) goto LAB_00112ef4;
  local_b8.ptr_column = (pointer_index)0x1475f1;
  testing::ContainsRegex<char_const*>
            ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_98,
             (testing *)&local_b8,regex);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_48,(PolymorphicMatcher *)&local_98);
  if (local_90[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90[0]);
  }
  bVar5 = testing::internal::DeathTest::Create
                    ("remove_warning = row.at(0)",
                     (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&local_48,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                     ,0x158,(DeathTest **)&local_a8);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_48);
  piVar2 = local_a8.ptr_column;
  bVar4 = true;
  if (bVar5) {
    if ((long *)local_a8.ptr_column != (long *)0x0) {
      iVar7 = (**(code **)(*(long *)local_a8.ptr_column + 0x10))(local_a8.ptr_column);
      piVar3 = local_a8.ptr_column;
      if (iVar7 == 0) {
        iVar7 = (**(code **)(*(long *)local_a8.ptr_column + 0x18))(local_a8.ptr_column);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar7);
        cVar6 = (**(code **)(*(long *)piVar3 + 0x20))(piVar3,bVar4);
        if (cVar6 != '\0') goto LAB_00112edd;
        bVar4 = true;
        bVar5 = false;
      }
      else {
        if (iVar7 == 1) {
          bVar4 = testing::internal::AlwaysTrue();
          if (bVar4) {
            local_98.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_4_ = 0;
            Disa::Matrix_Sparse_Row<double,_int>::at(&local_78,(index_type *)&local_98);
          }
          (**(code **)(*(long *)local_a8.ptr_column + 0x28))(local_a8.ptr_column,2);
          (**(code **)(*(long *)piVar3 + 0x28))(piVar3,0);
        }
LAB_00112edd:
        bVar4 = false;
        bVar5 = true;
      }
      (**(code **)(*(long *)piVar2 + 8))(piVar2);
      if (!bVar5) goto LAB_00112ef0;
    }
    bVar4 = false;
  }
LAB_00112ef0:
  if (!bVar4) {
    return;
  }
LAB_00112ef4:
  testing::Message::Message(&local_98);
  pcVar9 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
             ,0x158,pcVar9);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,&local_98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
  if ((long *)CONCAT44(local_98.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_98.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_98.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_98.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, empty_row) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 1);

  EXPECT_EQ(row.row_offset(), 2);
  EXPECT_EQ(row.size_non_zero(), 0);
  EXPECT_EQ(row.row(), 1);
  EXPECT_EQ(row.begin(), row.end());
  EXPECT_EQ(row.cbegin(), row.cend());
  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row.at(0), ".*");
}